

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# host_ca_new_free.c
# Opt level: O2

host_ca * host_ca_new(void)

{
  host_ca *phVar1;
  
  phVar1 = (host_ca *)safemalloc(1,0x20,0);
  phVar1->validity_expression = (char *)0x0;
  *(undefined8 *)&phVar1->opts = 0;
  phVar1->name = (char *)0x0;
  phVar1->ca_public_key = (strbuf *)0x0;
  (phVar1->opts).permit_rsa_sha256 = true;
  (phVar1->opts).permit_rsa_sha512 = true;
  return phVar1;
}

Assistant:

host_ca *host_ca_new(void)
{
    host_ca *hca = snew(host_ca);
    memset(hca, 0, sizeof(*hca));
    hca->opts.permit_rsa_sha1 = false;
    hca->opts.permit_rsa_sha256 = true;
    hca->opts.permit_rsa_sha512 = true;
    return hca;
}